

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

string * el::base::utils::OS::currentUser_abi_cxx11_(void)

{
  string *in_RDI;
  char *in_stack_00000038;
  char *in_stack_00000040;
  char *in_stack_00000048;
  
  getEnvironmentVariable_abi_cxx11_(in_stack_00000048,in_stack_00000040,in_stack_00000038);
  return in_RDI;
}

Assistant:

std::string OS::currentUser(void) {
#if ELPP_OS_UNIX && !ELPP_OS_ANDROID
  return getEnvironmentVariable("USER", base::consts::kUnknownUser, "whoami");
#elif ELPP_OS_WINDOWS
  return getEnvironmentVariable("USERNAME", base::consts::kUnknownUser);
#elif ELPP_OS_ANDROID
  ELPP_UNUSED(base::consts::kUnknownUser);
  return std::string("android");
#else
  return std::string();
#endif  // ELPP_OS_UNIX && !ELPP_OS_ANDROID
}